

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

FlagBase * __thiscall args::Group::Match<char>(Group *this,char *flag)

{
  bool bVar1;
  char *flag_00;
  reference ppBVar2;
  FlagBase *pFVar3;
  Group *in_RSI;
  long in_RDI;
  FlagBase *match_1;
  Group *group;
  FlagBase *match;
  FlagBase *flagBase;
  Base *child;
  iterator __end2;
  iterator __begin2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *in_stack_ffffffffffffff88;
  Base *in_stack_ffffffffffffff90;
  Base *pBVar4;
  long *local_68;
  __normal_iterator<args::Base_**,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
  local_28;
  
  flag_00 = (char *)(in_RDI + 0x30);
  local_28._M_current =
       (Base **)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin
                          (in_stack_ffffffffffffff88);
  std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end(in_stack_ffffffffffffff88);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<args::Base_**,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<args::Base_**,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) {
      return (FlagBase *)0x0;
    }
    ppBVar2 = __gnu_cxx::
              __normal_iterator<args::Base_**,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
              ::operator*(&local_28);
    pBVar4 = *ppBVar2;
    if (pBVar4 == (Base *)0x0) {
      local_68 = (long *)0x0;
    }
    else {
      local_68 = (long *)__dynamic_cast(pBVar4,&Base::typeinfo,&FlagBase::typeinfo,0);
    }
    if (local_68 == (long *)0x0) {
      if (pBVar4 == (Base *)0x0) {
        in_stack_ffffffffffffff88 = (vector<args::Base_*,_std::allocator<args::Base_*>_> *)0x0;
      }
      else {
        in_stack_ffffffffffffff88 =
             (vector<args::Base_*,_std::allocator<args::Base_*>_> *)
             __dynamic_cast(pBVar4,&Base::typeinfo,&typeinfo,0);
      }
      if (in_stack_ffffffffffffff88 != (vector<args::Base_*,_std::allocator<args::Base_*>_> *)0x0) {
        pFVar3 = Match<char>(in_RSI,flag_00);
        goto joined_r0x0017930a;
      }
    }
    else {
      pFVar3 = (FlagBase *)
               (**(code **)(*local_68 + 0x38))
                         (local_68,(int)*(char *)&(in_RSI->super_Base)._vptr_Base);
      pBVar4 = in_stack_ffffffffffffff90;
joined_r0x0017930a:
      if (pFVar3 != (FlagBase *)0x0) {
        return pFVar3;
      }
    }
    __gnu_cxx::
    __normal_iterator<args::Base_**,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>::
    operator++(&local_28);
    in_stack_ffffffffffffff90 = pBVar4;
  } while( true );
}

Assistant:

FlagBase *Match(const T &flag)
            {
                for (Base *child: children)
                {
                    if (FlagBase *flagBase = dynamic_cast<FlagBase *>(child))
                    {
                        if (FlagBase *match = flagBase->Match(flag))
                        {
                            return match;
                        }
                    } else if (Group *group = dynamic_cast<Group *>(child))
                    {
                        if (FlagBase *match = group->Match(flag))
                        {
                            return match;
                        }
                    }
                }
                return nullptr;
            }